

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st_start.cpp
# Opt level: O3

void __thiscall FTTYStartupScreen::NetInit(FTTYStartupScreen *this,char *message,int numplayers)

{
  ulong uVar1;
  undefined8 uVar2;
  char *__format;
  termios rawtermios;
  
  if ((this->super_FStartupScreen).field_0x14 == '\0') {
    fwrite("Press \'Q\' to abort network game synchronization.",0x30,1,_stderr);
    tcgetattr(0,(termios *)&this->OldTermIOS);
    rawtermios.c_iflag = (this->OldTermIOS).c_iflag;
    rawtermios.c_oflag = (this->OldTermIOS).c_oflag;
    uVar1._0_4_ = (this->OldTermIOS).c_cflag;
    uVar1._4_4_ = (this->OldTermIOS).c_lflag;
    rawtermios.c_line = (this->OldTermIOS).c_line;
    rawtermios.c_cc[0] = (this->OldTermIOS).c_cc[0];
    rawtermios.c_cc[1] = (this->OldTermIOS).c_cc[1];
    rawtermios.c_cc[2] = (this->OldTermIOS).c_cc[2];
    rawtermios.c_cc[3] = (this->OldTermIOS).c_cc[3];
    rawtermios.c_cc[4] = (this->OldTermIOS).c_cc[4];
    rawtermios.c_cc[5] = (this->OldTermIOS).c_cc[5];
    rawtermios.c_cc[6] = (this->OldTermIOS).c_cc[6];
    rawtermios.c_cc._7_8_ = *(undefined8 *)((this->OldTermIOS).c_cc + 7);
    rawtermios.c_cc._15_8_ = *(undefined8 *)((this->OldTermIOS).c_cc + 0xf);
    uVar2 = *(undefined8 *)((this->OldTermIOS).c_cc + 0x1b);
    rawtermios.c_ispeed = (this->OldTermIOS).c_ispeed;
    rawtermios.c_ospeed = (this->OldTermIOS).c_ospeed;
    rawtermios.c_cc._23_4_ = SUB84(*(undefined8 *)((this->OldTermIOS).c_cc + 0x17),0);
    rawtermios.c_cc._27_4_ = SUB84(uVar2,0);
    rawtermios._48_4_ = SUB84((ulong)uVar2 >> 0x20,0);
    rawtermios._8_8_ = uVar1 & 0xfffffff5ffffffff;
    tcsetattr(0,0,(termios *)&rawtermios);
    (this->super_FStartupScreen).field_0x14 = 1;
  }
  __format = "\n%s: ";
  if (numplayers == 1) {
    __format = "\n%s.";
  }
  fprintf(_stderr,__format,message);
  fflush(_stderr);
  this->TheNetMessage = message;
  this->NetMaxPos = numplayers;
  this->NetCurPos = 0;
  (*(this->super_FStartupScreen)._vptr_FStartupScreen[6])(this,1);
  return;
}

Assistant:

void FTTYStartupScreen::NetInit(const char *message, int numplayers)
{
	if (!DidNetInit)
	{
		termios rawtermios;

		fprintf (stderr, "Press 'Q' to abort network game synchronization.");
		// Set stdin to raw mode so we can get keypresses in ST_CheckNetAbort()
		// immediately without waiting for an EOL.
		tcgetattr (STDIN_FILENO, &OldTermIOS);
		rawtermios = OldTermIOS;
		rawtermios.c_lflag &= ~(ICANON | ECHO);
		tcsetattr (STDIN_FILENO, TCSANOW, &rawtermios);
		DidNetInit = true;
	}
	if (numplayers == 1)
	{
		// Status message without any real progress info.
		fprintf (stderr, "\n%s.", message);
	}
	else
	{
		fprintf (stderr, "\n%s: ", message);
	}
	fflush (stderr);
	TheNetMessage = message;
	NetMaxPos = numplayers;
	NetCurPos = 0;
	NetProgress(1);		// You always know about yourself
}